

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprFunction(Parse *pParse,ExprList *pList,Token *pToken,int eDistinct)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Expr *pNew;
  int eDistinct_local;
  Token *pToken_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pParse_local = (Parse *)sqlite3ExprAlloc(db_00,0x9d,pToken,1);
  if (pParse_local == (Parse *)0x0) {
    sqlite3ExprListDelete(db_00,pList);
    pParse_local = (Parse *)0x0;
  }
  else {
    if ((pList != (ExprList *)0x0) && (pParse->db->aLimit[6] < pList->nExpr)) {
      sqlite3ErrorMsg(pParse,"too many arguments on function %T",pToken);
    }
    ((anon_union_8_2_a01b6dbf_for_x *)&pParse_local->isMultiWrite)->pList = pList;
    *(u32 *)((long)&pParse_local->db + 4) = *(u32 *)((long)&pParse_local->db + 4) | 4;
    sqlite3ExprSetHeightAndFlags(pParse,(Expr *)pParse_local);
    if (eDistinct == 1) {
      *(u32 *)((long)&pParse_local->db + 4) = *(u32 *)((long)&pParse_local->db + 4) | 0x10;
    }
  }
  return (Expr *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprFunction(
  Parse *pParse,        /* Parsing context */
  ExprList *pList,      /* Argument list */
  Token *pToken,        /* Name of the function */
  int eDistinct         /* SF_Distinct or SF_ALL or 0 */
){
  Expr *pNew;
  sqlite3 *db = pParse->db;
  assert( pToken );
  pNew = sqlite3ExprAlloc(db, TK_FUNCTION, pToken, 1);
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList); /* Avoid memory leak when malloc fails */
    return 0;
  }
  if( pList && pList->nExpr > pParse->db->aLimit[SQLITE_LIMIT_FUNCTION_ARG] ){
    sqlite3ErrorMsg(pParse, "too many arguments on function %T", pToken);
  }
  pNew->x.pList = pList;
  ExprSetProperty(pNew, EP_HasFunc);
  assert( !ExprHasProperty(pNew, EP_xIsSelect) );
  sqlite3ExprSetHeightAndFlags(pParse, pNew);
  if( eDistinct==SF_Distinct ) ExprSetProperty(pNew, EP_Distinct);
  return pNew;
}